

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::pushHash
          (Dictionary *this,vector<int,_std::allocator<int>_> *hashes,int32_t id)

{
  size_type sVar1;
  int in_EDX;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_RDI;
  value_type_conflict1 *in_stack_ffffffffffffffd8;
  
  if ((in_RDI[2]._M_h._M_buckets != (__buckets_ptr)0x0) && (-1 < in_EDX)) {
    if (0 < (long)in_RDI[2]._M_h._M_buckets) {
      sVar1 = std::
              unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::count(in_RDI,in_stack_ffffffffffffffd8);
      if (sVar1 == 0) {
        return;
      }
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::at(in_RDI,in_stack_ffffffffffffffd8);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void Dictionary::pushHash(std::vector<int32_t>& hashes, int32_t id) const {
  if (pruneidx_size_ == 0 || id < 0) {
    return;
  }
  if (pruneidx_size_ > 0) {
    if (pruneidx_.count(id)) {
      id = pruneidx_.at(id);
    } else {
      return;
    }
  }
  hashes.push_back(nwords_ + id);
}